

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_aastrip(CHAR_DATA *ch,char *argument)

{
  char *in_RSI;
  long in_RDI;
  AREA_DATA_conflict *area;
  AREA_AFFECT_DATA *af_next;
  AREA_AFFECT_DATA *af;
  void *arg2;
  undefined8 *in_stack_ffffffffffffffe0;
  undefined8 *puVar1;
  
  arg2 = *(void **)(*(long *)(in_RDI + 0xa8) + 0x30);
  puVar1 = *(undefined8 **)((long)arg2 + 0x88);
  while (puVar1 != (undefined8 *)0x0) {
    in_stack_ffffffffffffffe0 = (undefined8 *)*puVar1;
    affect_remove_area((AREA_DATA_conflict *)ch,(AREA_AFFECT_DATA *)argument);
    puVar1 = in_stack_ffffffffffffffe0;
  }
  act(in_RSI,(CHAR_DATA *)0x0,in_stack_ffffffffffffffe0,arg2,0);
  return;
}

Assistant:

void do_aastrip(CHAR_DATA *ch, char *argument)
{
	AREA_AFFECT_DATA *af, *af_next;
	AREA_DATA *area = ch->in_room->area;

	for (af = area->affected; af; af = af_next)
	{
		af_next = af->next;
		affect_remove_area(area, af);
	}

	act("All affects stripped from '$t'.", ch, area->name, 0, TO_CHAR);
}